

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O3

char * __thiscall phosg::basename(phosg *this,char *__filename)

{
  size_type __pos;
  char *pcVar1;
  long lVar2;
  long lVar3;
  size_type sVar4;
  
  lVar2 = *(long *)__filename;
  lVar3 = *(long *)(__filename + 8);
  if (lVar3 == 0) {
LAB_0010e50e:
    *(phosg **)this = this + 0x10;
    ::std::__cxx11::string::_M_construct<char*>((string *)this,lVar2,lVar3 + lVar2);
  }
  else {
    sVar4 = lVar3 + 1;
    do {
      if (sVar4 == 1) goto LAB_0010e50e;
      __pos = sVar4 - 1;
      pcVar1 = (char *)(lVar2 + -2 + sVar4);
      sVar4 = __pos;
    } while (*pcVar1 != '/');
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename,__pos
               ,0xffffffffffffffff);
  }
  return (char *)this;
}

Assistant:

std::string basename(const std::string& filename) {
  size_t slash_pos = filename.rfind('/');
  return (slash_pos == string::npos) ? filename : filename.substr(slash_pos + 1);
}